

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall
ki::dml::Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
set_value(Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,FieldBase *other)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  char *pcVar4;
  value_error *this_00;
  undefined8 local_208;
  string local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream oss;
  undefined1 local_40 [40];
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *real_other;
  FieldBase *other_local;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  real_other = (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)other;
  other_local = &this->super_FieldBase;
  bVar1 = FieldBase::is_type<std::__cxx11::string>(other);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar3 = std::operator<<((ostream *)local_1c8,"Tried to copy value from ");
    iVar2 = (*(real_other->super_FieldBase).super_Serializable._vptr_Serializable[5])();
    poVar3 = std::operator<<(poVar3,(char *)CONCAT44(extraout_var,iVar2));
    poVar3 = std::operator<<(poVar3," field to ");
    pcVar4 = get_type_name(this);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3," field.");
    this_00 = (value_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    value_error::value_error(this_00,local_1e8);
    __cxa_throw(this_00,&value_error::typeinfo,value_error::~value_error);
  }
  if (real_other ==
      (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
     ) {
    local_208 = 0;
  }
  else {
    local_208 = __dynamic_cast(real_other,&FieldBase::typeinfo,
                               &Field<std::__cxx11::string>::typeinfo,0);
  }
  local_40._32_8_ = local_208;
  get_value((Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_40);
  set_value(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void set_value(FieldBase *other) final
		{
			if (other->is_type<ValueT>())
			{
				auto *real_other = dynamic_cast<Field<ValueT> *>(other);
				set_value(real_other->get_value());
			}
			else
			{
				std::ostringstream oss;
				oss << "Tried to copy value from " <<
					other->get_type_name() << " field to " <<
					get_type_name() << " field.";
				throw value_error(oss.str());
			}
		}